

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra> *this,void **vtt,int64_t id,
          TPZVec<long> *nodeindexes,int matind,TPZGeoMesh *mesh)

{
  void *pvVar1;
  
  TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>,vtt + 1,id,nodeindexes,matind,
             mesh);
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>).super_TPZGeoEl = pvVar1;
  *(void **)((long)(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>).fGeo.
                   super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes +
            *(long *)((long)pvVar1 + -0x60) + -0x48) = vtt[5];
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  (this->fSubEl).fNAlloc = 0;
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(&this->fRefPattern);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(id,nodeindexes,matind,mesh) {
}